

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::add_sample
          (TypedTimeSamples<std::vector<long,_std::allocator<long>_>_> *this,double t,
          vector<long,_std::allocator<long>_> *v)

{
  Sample s;
  undefined1 local_38 [8];
  pointer local_30;
  undefined1 uStack_28;
  undefined7 uStack_27;
  undefined1 uStack_20;
  undefined8 uStack_1f;
  
  uStack_20 = 0;
  uStack_1f = 0;
  local_30 = (pointer)0x0;
  uStack_28 = 0;
  uStack_27 = 0;
  local_38 = (undefined1  [8])t;
  std::vector<long,_std::allocator<long>_>::operator=
            ((vector<long,_std::allocator<long>_> *)&local_30,v);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<long,std::allocator<long>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,std::allocator<long>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<long,std::allocator<long>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<long,std::allocator<long>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,std::allocator<long>>>::Sample>>
              *)this,(Sample *)local_38);
  this->_dirty = true;
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_30);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }